

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
          *localGenerators)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  pointer pcVar5;
  cmMakefile *pcVar6;
  ulong uVar7;
  GeneratorTargetVector *this_01;
  pointer pcVar8;
  size_type sVar9;
  Keywords *pKVar10;
  string *psVar11;
  char *str;
  undefined1 rcc_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  pair<std::_Rb_tree_iterator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar12;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar13;
  byte local_4be;
  byte local_4bd;
  byte local_4bc;
  bool local_4bb;
  byte local_4ba;
  byte local_4b9;
  byte local_4b8;
  byte local_4b7;
  byte local_4b6;
  bool local_4b5;
  IntegerVersion local_320;
  cmGeneratorTarget *local_318;
  unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_> local_310;
  string local_308;
  undefined1 local_2e8 [8];
  string msg;
  cmAlphaNum component;
  cmAlphaNum version;
  bool local_24f;
  bool local_24e;
  undefined1 local_24d [3];
  bool rccDisabled;
  bool uicDisabled;
  bool mocDisabled;
  bool rccIsValid;
  bool uicIsValid;
  bool mocIsValid;
  bool rccAvailable;
  bool uicAvailable;
  bool mocAvailable;
  bool validQt;
  uint local_240;
  string local_238;
  IntegerVersion local_214;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> qtVersion;
  string *rccExec;
  string *uicExec;
  string *mocExec;
  bool rcc;
  bool uic;
  bool moc;
  key_type local_1e0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_190;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *languages;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  pointer local_158;
  allocator<char> local_149;
  string local_148;
  undefined1 local_128 [8];
  string targetName_1;
  string local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  pointer local_d0;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string targetName;
  string local_78;
  cmMakefile *local_58;
  cmMakefile *makefile;
  bool globalAutoRccTarget;
  reference puStack_48;
  bool globalAutoGenTarget;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  *__range1;
  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  *localGenerators_local;
  cmQtAutoGenGlobalInitializer *this_local;
  
  std::
  vector<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ::vector(&this->Initializers_);
  std::
  map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->GlobalAutoGenTargets_);
  std::
  map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->GlobalAutoRccTargets_);
  cmQtAutoGen::
  ConfigStrings<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>_>
  ::ConfigStrings(&this->CompilerFeatures_);
  Keywords::Keywords(&this->Keywords_);
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(localGenerators);
  localGen = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
             std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::end(localGenerators);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                *)&localGen);
    if (!bVar1) break;
    puStack_48 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                 ::operator*(&__end1);
    makefile._7_1_ = 0;
    makefile._6_1_ = 0;
    pcVar5 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (puStack_48);
    pcVar6 = cmLocalGenerator::GetMakefile(pcVar5);
    local_58 = pcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_GLOBAL_AUTOGEN_TARGET",
               (allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
    bVar1 = cmMakefile::IsOn(pcVar6,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
    pcVar6 = local_58;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME",&local_c1);
      psVar11 = cmMakefile::GetSafeDefinition(pcVar6,&local_c0);
      std::__cxx11::string::string((string *)local_a0,(string *)psVar11);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_a0,"autogen");
      }
      local_d0 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::get
                           (puStack_48);
      pVar12 = std::
               map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               ::emplace<cmLocalGenerator*,std::__cxx11::string>
                         ((map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                           *)&this->GlobalAutoGenTargets_,&local_d0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0);
      local_e0 = (_Base_ptr)pVar12.first._M_node;
      local_d8 = pVar12.second;
      makefile._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_a0);
    }
    pcVar6 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"CMAKE_GLOBAL_AUTORCC_TARGET",
               (allocator<char> *)(targetName_1.field_2._M_local_buf + 0xf));
    bVar1 = cmMakefile::IsOn(pcVar6,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)(targetName_1.field_2._M_local_buf + 0xf));
    pcVar6 = local_58;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME",&local_149);
      psVar11 = cmMakefile::GetSafeDefinition(pcVar6,&local_148);
      std::__cxx11::string::string((string *)local_128,(string *)psVar11);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_128,"autorcc");
      }
      local_158 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::get
                            (puStack_48);
      std::
      map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
      ::emplace<cmLocalGenerator*,std::__cxx11::string>
                ((map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                  *)&this->GlobalAutoRccTargets_,&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      makefile._6_1_ = 1;
      std::__cxx11::string::~string((string *)local_128);
    }
    pcVar5 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (puStack_48);
    this_01 = cmLocalGenerator::GetGeneratorTargets(pcVar5);
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin(this_01);
    target = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
             std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                  *)&target);
      if (!bVar1) break;
      languages = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__gnu_cxx::
                     __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                     ::operator*(&__end2);
      pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                          languages);
      TVar4 = cmGeneratorTarget::GetType(pcVar8);
      if (TVar4 < UTILITY) {
        pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             *)languages);
        bVar1 = cmGeneratorTarget::IsImported(pcVar8);
        if (!bVar1) {
          pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)languages);
          cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_(&local_1c0,pcVar8);
          local_190 = &local_1c0;
          pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)languages);
          cmGeneratorTarget::ClearSourcesCache(pcVar8);
          this_00 = local_190;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e0,"CSharp",(allocator<char> *)&moc);
          sVar9 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(this_00,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::allocator<char>::~allocator((allocator<char> *)&moc);
          if (sVar9 == 0) {
            pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                     operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 *)languages);
            pKVar10 = kw(this);
            bVar1 = cmGeneratorTarget::GetPropertyAsBool(pcVar8,&pKVar10->AUTOMOC);
            pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                     operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 *)languages);
            pKVar10 = kw(this);
            bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar8,&pKVar10->AUTOUIC);
            pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                     operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 *)languages);
            pKVar10 = kw(this);
            bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar8,&pKVar10->AUTORCC);
            if (((bVar1) || (bVar2)) || (bVar3)) {
              pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                       operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   *)languages);
              pKVar10 = kw(this);
              psVar11 = cmGeneratorTarget::GetSafeProperty(pcVar8,&pKVar10->AUTOMOC_EXECUTABLE);
              pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                       operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   *)languages);
              pKVar10 = kw(this);
              cmGeneratorTarget::GetSafeProperty(pcVar8,&pKVar10->AUTOUIC_EXECUTABLE);
              pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                       operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   *)languages);
              pKVar10 = kw(this);
              qtVersion._4_8_ =
                   cmGeneratorTarget::GetSafeProperty(pcVar8,&pKVar10->AUTORCC_EXECUTABLE);
              pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                       get((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *
                           )languages);
              std::__cxx11::string::string((string *)&local_238,(string *)psVar11);
              pVar13 = cmQtAutoGenInitializer::GetQtVersion(pcVar8,&local_238);
              qtVersion.first.Major = pVar13.second;
              local_214 = pVar13.first;
              _mocDisabled = pVar13;
              std::__cxx11::string::~string((string *)&local_238);
              local_4b5 = true;
              if ((local_214.Major != 4) && (local_4b5 = true, local_214.Major != 5)) {
                local_4b5 = local_214.Major == 6;
              }
              uicDisabled = local_4b5;
              local_4b6 = 1;
              if (local_4b5 == false) {
                local_4b6 = std::__cxx11::string::empty();
                local_4b6 = local_4b6 ^ 0xff;
              }
              rccDisabled = (bool)(local_4b6 & 1);
              local_4b7 = 1;
              if ((uicDisabled & 1U) == 0) {
                local_4b7 = std::__cxx11::string::empty();
                local_4b7 = local_4b7 ^ 0xff;
              }
              local_24d[2] = local_4b7 & 1;
              local_4b8 = 1;
              if ((uicDisabled & 1U) == 0) {
                local_4b8 = std::__cxx11::string::empty();
                local_4b8 = local_4b8 ^ 0xff;
              }
              rcc_00 = SUB81(in_R8,0);
              local_24d[1] = local_4b8 & 1;
              local_4b9 = 0;
              if (bVar1) {
                local_4b9 = rccDisabled;
              }
              local_24d[0] = (_Alloc_hider)(local_4b9 & 1);
              local_4ba = 0;
              if (bVar2) {
                local_4ba = local_24d[2];
              }
              local_24e = (bool)(local_4ba & 1);
              local_4bb = false;
              if (bVar3) {
                local_4bb = (bool)local_24d[1];
              }
              local_24f = local_4bb;
              local_4bc = 0;
              if (bVar1) {
                local_4bc = rccDisabled ^ 0xff;
              }
              local_4bd = 0;
              if (bVar2) {
                local_4bd = local_24d[2] ^ 0xff;
              }
              bVar1 = (bool)(local_4bd & 1);
              local_4be = 0;
              if (bVar3) {
                local_4be = local_24d[1] ^ 0xff;
              }
              if ((((local_4bc & 1) != 0) || (bVar1 != false)) || ((bool)(local_4be & 1) != false))
              {
                if (qtVersion.first.Major == 0) {
                  cmAlphaNum::cmAlphaNum((cmAlphaNum *)(component.Digits_ + 0x18),"<QTVERSION>");
                }
                else {
                  cmAlphaNum::cmAlphaNum
                            ((cmAlphaNum *)(component.Digits_ + 0x18),qtVersion.first.Major);
                }
                str = "Core";
                if (bVar1 != false) {
                  str = "Widgets";
                }
                cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&msg.field_2 + 8),str);
                pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ::operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                       *)languages);
                psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8);
                cmQtAutoGen::Tools_abi_cxx11_
                          (&local_308,(cmQtAutoGen *)(ulong)(local_4bc & 1),bVar1,
                           (bool)(local_4be & 1),(bool)rcc_00);
                in_R8 = &local_308;
                cmStrCat<char_const(&)[47],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[30],char_const(&)[18],cmAlphaNum&,char_const(&)[13],cmAlphaNum&,char_const(&)[3],char_const(&)[29]>
                          ((string *)local_2e8,
                           (char (*) [47])"AUTOGEN: No valid Qt version found for target ",psVar11,
                           (char (*) [4])0x111e96b,in_R8,
                           (char (*) [30])" disabled.  Consider adding:\n",
                           (char (*) [18])"  find_package(Qt",
                           (cmAlphaNum *)(component.Digits_ + 0x18),(char (*) [13])" COMPONENTS ",
                           (cmAlphaNum *)((long)&msg.field_2 + 8),(char (*) [3])0x114ddd6,
                           (char (*) [29])"to your CMakeLists.txt file.");
                std::__cxx11::string::~string((string *)&local_308);
                pcVar8 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ::operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                       *)languages);
                cmMakefile::IssueMessage(pcVar8->Makefile,AUTHOR_WARNING,(string *)local_2e8);
                std::__cxx11::string::~string((string *)local_2e8);
              }
              if (((((byte)local_24d[0] & 1) != 0) || ((local_24e & 1U) != 0)) ||
                 ((local_24f & 1U) != 0)) {
                local_318 = (cmGeneratorTarget *)this;
                local_320 = (IntegerVersion)
                            std::
                            unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                            get((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 *)languages);
                in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_24d;
                std::
                make_unique<cmQtAutoGenInitializer,cmQtAutoGenGlobalInitializer*,cmGeneratorTarget*,cmQtAutoGen::IntegerVersion_const&,bool_const&,bool_const&,bool_const&,bool&,bool&>
                          ((cmQtAutoGenGlobalInitializer **)&local_310,&local_318,&local_320,
                           (bool *)&local_214,(bool *)in_R8,&local_24e,&local_24f,
                           (bool *)((long)&makefile + 7));
                std::
                vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                ::
                emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                          ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                            *)this,&local_310);
                std::
                unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>::
                ~unique_ptr(&local_310);
              }
            }
          }
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set(&local_1c0);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<std::unique_ptr<cmLocalGenerator>> const& localGenerators)
{
  for (const auto& localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile const* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTOGEN_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        this->GlobalAutoGenTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTORCC_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        this->GlobalAutoRccTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (const auto& target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }
      std::set<std::string> const& languages =
        target->GetAllConfigCompileLanguages();
      // cmGeneratorTarget::GetAllConfigCompileLanguages caches the target's
      // sources. Clear it so that OBJECT library targets that are AUTOGEN
      // initialized after this target get their added mocs_compilation.cpp
      // source acknowledged by this target.
      target->ClearSourcesCache();
      if (languages.count("CSharp")) {
        // Don't process target if it's a CSharp target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(this->kw().AUTOMOC);
      bool const uic = target->GetPropertyAsBool(this->kw().AUTOUIC);
      bool const rcc = target->GetPropertyAsBool(this->kw().AUTORCC);
      if (moc || uic || rcc) {
        std::string const& mocExec =
          target->GetSafeProperty(this->kw().AUTOMOC_EXECUTABLE);
        std::string const& uicExec =
          target->GetSafeProperty(this->kw().AUTOUIC_EXECUTABLE);
        std::string const& rccExec =
          target->GetSafeProperty(this->kw().AUTORCC_EXECUTABLE);

        // We support Qt4, Qt5 and Qt6
        auto const qtVersion =
          cmQtAutoGenInitializer::GetQtVersion(target.get(), mocExec);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          cmAlphaNum version = (qtVersion.second == 0)
            ? cmAlphaNum("<QTVERSION>")
            : cmAlphaNum(qtVersion.second);
          cmAlphaNum component = uicDisabled ? "Widgets" : "Core";

          std::string const msg = cmStrCat(
            "AUTOGEN: No valid Qt version found for target ",
            target->GetName(), ".  ",
            cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled),
            " disabled.  Consider adding:\n", "  find_package(Qt", version,
            " COMPONENTS ", component, ")\n", "to your CMakeLists.txt file.");
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          this->Initializers_.emplace_back(
            cm::make_unique<cmQtAutoGenInitializer>(
              this, target.get(), qtVersion.first, mocIsValid, uicIsValid,
              rccIsValid, globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}